

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t
validation_layer::zeEventCreate
          (ze_event_pool_handle_t hEventPool,ze_event_desc_t *desc,ze_event_handle_t *phEvent)

{
  code *pcVar1;
  ze_result_t zVar2;
  ze_result_t result_00;
  element_type *this;
  size_type sVar3;
  reference ppvVar4;
  pointer pHVar5;
  size_type sStack_90;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t driver_result;
  ze_result_t result_1;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  ze_pfnEventCreate_t pfnCreate;
  allocator local_49;
  string local_48 [32];
  ze_event_handle_t *local_28;
  ze_event_handle_t *phEvent_local;
  ze_event_desc_t *desc_local;
  ze_event_pool_handle_t hEventPool_local;
  
  local_28 = phEvent;
  phEvent_local = (ze_event_handle_t *)desc;
  desc_local = (ze_event_desc_t *)hEventPool;
  this = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"zeEventCreate(hEventPool, desc, phEvent)",&local_49);
  loader::Logger::log_trace(this,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar1 = *(code **)(context + 0x4a0);
  if (pcVar1 == (code *)0x0) {
    hEventPool_local._4_4_ =
         logAndPropagateResult("zeEventCreate",ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);
  }
  else {
    sVar3 = std::
            vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
            ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                    *)(context + 0xd30));
    for (_result_1 = 0; _result_1 < sVar3; _result_1 = _result_1 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),_result_1);
      zVar2 = (*(*ppvVar4)->zeValidation->_vptr_ZEValidationEntryPoints[0x7c])
                        ((*ppvVar4)->zeValidation,desc_local,phEvent_local,local_28);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeEventCreate",zVar2);
        return zVar2;
      }
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      pHVar5 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      zVar2 = ZEHandleLifetimeValidation::zeEventCreatePrologue
                        (&pHVar5->zeHandleLifetime,(ze_event_pool_handle_t)desc_local,
                         (ze_event_desc_t *)phEvent_local,local_28);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeEventCreate",zVar2);
        return zVar2;
      }
    }
    zVar2 = (*pcVar1)(desc_local,phEvent_local,local_28);
    for (sStack_90 = 0; sStack_90 < sVar3; sStack_90 = sStack_90 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_90);
      result_00 = (*(*ppvVar4)->zeValidation->_vptr_ZEValidationEntryPoints[0x7d])
                            ((*ppvVar4)->zeValidation,desc_local,phEvent_local,local_28,(ulong)zVar2
                            );
      if (result_00 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeEventCreate",result_00);
        return zVar2;
      }
    }
    if (((zVar2 == ZE_RESULT_SUCCESS) && ((*(byte *)(context + 4) & 1) != 0)) &&
       (local_28 != (ze_event_handle_t *)0x0)) {
      pHVar5 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      HandleLifetimeValidation::addHandle(pHVar5,*local_28);
      pHVar5 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      HandleLifetimeValidation::addDependent(pHVar5,desc_local,*local_28);
    }
    hEventPool_local._4_4_ = logAndPropagateResult("zeEventCreate",zVar2);
  }
  return hEventPool_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventCreate(
        ze_event_pool_handle_t hEventPool,              ///< [in] handle of the event pool
        const ze_event_desc_t* desc,                    ///< [in] pointer to event descriptor
        ze_event_handle_t* phEvent                      ///< [out] pointer to handle of event object created
        )
    {
        context.logger->log_trace("zeEventCreate(hEventPool, desc, phEvent)");

        auto pfnCreate = context.zeDdiTable.Event.pfnCreate;

        if( nullptr == pfnCreate )
            return logAndPropagateResult("zeEventCreate", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventCreatePrologue( hEventPool, desc, phEvent );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventCreate", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeEventCreatePrologue( hEventPool, desc, phEvent );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventCreate", result);
        }

        auto driver_result = pfnCreate( hEventPool, desc, phEvent );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventCreateEpilogue( hEventPool, desc, phEvent ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventCreate", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phEvent){
                context.handleLifetime->addHandle( *phEvent );
                context.handleLifetime->addDependent( hEventPool, *phEvent );

            }
        }
        return logAndPropagateResult("zeEventCreate", driver_result);
    }